

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

char query_key(char *query,int *count)

{
  char key_00;
  char key;
  int *count_local;
  char *query_local;
  
  key_00 = (*windowprocs.win_query_key)(query,count);
  log_query_key(key_00,count);
  if ((count == (int *)0x0) || (*count == -1)) {
    pline("<%s: %c>",query,(ulong)(uint)(int)key_00);
  }
  else {
    pline("<%s: %d %c>",query,(ulong)(uint)*count,(ulong)(uint)(int)key_00);
  }
  suppress_more();
  return key_00;
}

Assistant:

char query_key(const char *query, int *count)
{
	char key;
	key = (*windowprocs.win_query_key)(query, count);
	log_query_key(key, count);

	if (count && *count != -1)
	    pline("<%s: %d %c>", query, *count, key);
	else
	    pline("<%s: %c>", query, key);
	suppress_more();

	return key;
}